

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EqualsValueClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EqualsValueClauseSyntax,slang::syntax::EqualsValueClauseSyntax_const&>
          (BumpAllocator *this,EqualsValueClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  EqualsValueClauseSyntax *pEVar10;
  
  pEVar10 = (EqualsValueClauseSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->equals).kind;
  uVar7 = (args->equals).field_0x2;
  NVar8.raw = (args->equals).numFlags.raw;
  uVar9 = (args->equals).rawLen;
  pIVar3 = (args->equals).info;
  pEVar4 = (args->expr).ptr;
  (pEVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pEVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pEVar10->super_SyntaxNode).parent = pSVar1;
  (pEVar10->super_SyntaxNode).previewNode = pSVar2;
  (pEVar10->equals).kind = TVar6;
  (pEVar10->equals).field_0x2 = uVar7;
  (pEVar10->equals).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar10->equals).rawLen = uVar9;
  (pEVar10->equals).info = pIVar3;
  (pEVar10->expr).ptr = pEVar4;
  return pEVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }